

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int channel_mix_2_0_to_5_1(mixed_segment *segment)

{
  float fVar1;
  float fVar2;
  float sample;
  float fVar3;
  float fVar4;
  float rri;
  float rli;
  float lfei;
  float ci;
  float c;
  float ri;
  float li;
  uint32_t i;
  float *lfe;
  float *ce;
  float *rr;
  float *rl;
  float *fr;
  float *fl;
  float *r;
  float *l;
  undefined8 *puStack_18;
  uint32_t frames;
  channel_data *data;
  mixed_segment *segment_local;
  
  puStack_18 = (undefined8 *)segment->data;
  l._4_4_ = -NAN;
  data = (channel_data *)segment;
  mixed_buffer_request_read(&r,(uint32_t *)((long)&l + 4),(mixed_buffer *)*puStack_18);
  mixed_buffer_request_read(&fl,(uint32_t *)((long)&l + 4),(mixed_buffer *)puStack_18[1]);
  mixed_buffer_request_write(&fr,(uint32_t *)((long)&l + 4),(mixed_buffer *)puStack_18[0xe]);
  mixed_buffer_request_write(&rl,(uint32_t *)((long)&l + 4),(mixed_buffer *)puStack_18[0xf]);
  mixed_buffer_request_write(&rr,(uint32_t *)((long)&l + 4),(mixed_buffer *)puStack_18[0x10]);
  mixed_buffer_request_write(&ce,(uint32_t *)((long)&l + 4),(mixed_buffer *)puStack_18[0x11]);
  mixed_buffer_request_write(&lfe,(uint32_t *)((long)&l + 4),(mixed_buffer *)puStack_18[0x12]);
  mixed_buffer_request_write
            ((float **)&li,(uint32_t *)((long)&l + 4),(mixed_buffer *)puStack_18[0x13]);
  for (ri = 0.0; (uint)ri < (uint)l._4_4_; ri = (float)((int)ri + 1)) {
    fVar1 = r[(uint)ri];
    fVar2 = fl[(uint)ri];
    sample = (fVar1 + fVar2) * 0.5;
    fVar3 = biquad_sample(sample,(biquad_data *)((long)puStack_18 + 0xe4));
    fVar4 = biquad_sample(sample,(biquad_data *)(puStack_18 + 0x21));
    fr[(uint)ri] = fVar1;
    rl[(uint)ri] = fVar2;
    rr[(uint)ri] = (fVar1 + sample * -0.5 + fVar1) * 0.571;
    ce[(uint)ri] = (fVar2 + sample * -0.5 + fVar2) * 0.571;
    lfe[(uint)ri] = fVar3;
    _li[(uint)ri] = fVar4;
  }
  mixed_buffer_finish_read((uint32_t)l._4_4_,(mixed_buffer *)*puStack_18);
  mixed_buffer_finish_read((uint32_t)l._4_4_,(mixed_buffer *)puStack_18[1]);
  mixed_buffer_finish_write((uint32_t)l._4_4_,(mixed_buffer *)puStack_18[0xe]);
  mixed_buffer_finish_write((uint32_t)l._4_4_,(mixed_buffer *)puStack_18[0xf]);
  mixed_buffer_finish_write((uint32_t)l._4_4_,(mixed_buffer *)puStack_18[0x10]);
  mixed_buffer_finish_write((uint32_t)l._4_4_,(mixed_buffer *)puStack_18[0x11]);
  mixed_buffer_finish_write((uint32_t)l._4_4_,(mixed_buffer *)puStack_18[0x12]);
  mixed_buffer_finish_write((uint32_t)l._4_4_,(mixed_buffer *)puStack_18[0x13]);
  return 1;
}

Assistant:

VECTORIZE int channel_mix_2_0_to_5_1(struct mixed_segment *segment){
  struct channel_data *data = (struct channel_data *)segment->data;

  uint32_t frames = UINT32_MAX;
  float *restrict l, *restrict r, *restrict fl, *restrict fr, *restrict rl, *restrict rr, *restrict ce, *restrict lfe;
  mixed_buffer_request_read(&l, &frames, data->in[MIXED_LEFT]);
  mixed_buffer_request_read(&r, &frames, data->in[MIXED_RIGHT]);
  mixed_buffer_request_write(&fl, &frames, data->out[MIXED_LEFT_FRONT]);
  mixed_buffer_request_write(&fr, &frames, data->out[MIXED_RIGHT_FRONT]);
  mixed_buffer_request_write(&rl, &frames, data->out[MIXED_LEFT_REAR]);
  mixed_buffer_request_write(&rr, &frames, data->out[MIXED_RIGHT_REAR]);
  mixed_buffer_request_write(&ce, &frames, data->out[MIXED_CENTER]);
  mixed_buffer_request_write(&lfe, &frames, data->out[MIXED_SUBWOOFER]);
  for(uint32_t i=0; i<frames; ++i){
    float li = l[i];
    float ri = r[i];

    float c = (li+ri)*0.5f;
    float ci = biquad_sample(c, &data->lp[0]);
    float lfei = biquad_sample(c, &data->lp[1]);
    float rli = 0.571f * (li + (li - 0.5f * c));
    float rri = 0.571f * (ri + (ri - 0.5f * c));

    // FIXME: Hilbert is fucked. Reinstate when it works again.
    /* float r = biquad_sample(s, &data->lp[2]); */
    /* // 90 deg hilbert phase shift. This "automatically" induces a delay as well. */
    /* float rri = hilbert(r, delay, delay_size, delay_i); */
    /* delay_i = (delay_i+1) % delay_size; */
    /* float rli = -rri; */

    fl[i] = li;
    fr[i] = ri;
    rl[i] = rli;
    rr[i] = rri;
    ce[i] = ci;
    lfe[i] = lfei;
  }
  mixed_buffer_finish_read(frames, data->in[MIXED_LEFT]);
  mixed_buffer_finish_read(frames, data->in[MIXED_RIGHT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_LEFT_FRONT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_RIGHT_FRONT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_LEFT_REAR]);
  mixed_buffer_finish_write(frames, data->out[MIXED_RIGHT_REAR]);
  mixed_buffer_finish_write(frames, data->out[MIXED_CENTER]);
  mixed_buffer_finish_write(frames, data->out[MIXED_SUBWOOFER]);

  return 1;
}